

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reductors.cpp
# Opt level: O0

void opengv::absolute_pose::modules::gpnp5::groebnerRow35_00000_f
               (Matrix<double,_44,_80,_0,_44,_80> *groebnerMatrix,int targetRow)

{
  Scalar SVar1;
  Scalar *pSVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double factor;
  Index in_stack_ffffffffffffff58;
  DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1> *in_stack_ffffffffffffff60;
  DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1> *this;
  
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,0x9ca7a0);
  this = (DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1> *)*pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x9ca7c1);
  dVar3 = (double)this / *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x9ca7ee);
  *pSVar2 = 0.0;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x9ca81c);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x9ca840);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = SVar1;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *pSVar2;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar4,auVar12,auVar20);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x9ca896);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x9ca8ba);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = SVar1;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *pSVar2;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar5,auVar13,auVar21);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x9ca910);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x9ca934);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = SVar1;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *pSVar2;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar6,auVar14,auVar22);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x9ca98a);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x9ca9ae);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = SVar1;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *pSVar2;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar7,auVar15,auVar23);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x9caa04);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x9caa28);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = SVar1;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *pSVar2;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar8,auVar16,auVar24);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x9caa7e);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x9caaa2);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = SVar1;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *pSVar2;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar9,auVar17,auVar25);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x9caaf8);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x9cab1c);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = SVar1;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *pSVar2;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar10,auVar18,auVar26);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x9cab75);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x9cab9c);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = SVar1;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *pSVar2;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar11,auVar19,auVar27);
  *pSVar2 = auVar4._0_8_;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp5::groebnerRow35_00000_f( Eigen::Matrix<double,44,80> & groebnerMatrix, int targetRow )
{
  double factor = groebnerMatrix(targetRow,71) / groebnerMatrix(35,71);
  groebnerMatrix(targetRow,71) = 0.0;
  groebnerMatrix(targetRow,72) -= factor * groebnerMatrix(35,72);
  groebnerMatrix(targetRow,73) -= factor * groebnerMatrix(35,73);
  groebnerMatrix(targetRow,74) -= factor * groebnerMatrix(35,74);
  groebnerMatrix(targetRow,75) -= factor * groebnerMatrix(35,75);
  groebnerMatrix(targetRow,76) -= factor * groebnerMatrix(35,76);
  groebnerMatrix(targetRow,77) -= factor * groebnerMatrix(35,77);
  groebnerMatrix(targetRow,78) -= factor * groebnerMatrix(35,78);
  groebnerMatrix(targetRow,79) -= factor * groebnerMatrix(35,79);
}